

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_conserve.cpp
# Opt level: O1

Reals __thiscall
Omega_h::diffuse_densities_once
          (Omega_h *this,Mesh *mesh,Graph *g,Reals *densities,Reals *cell_sizes)

{
  int *piVar1;
  double dVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  Alloc *pAVar6;
  LO LVar7;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  double dVar12;
  Reals RVar13;
  Write<double> out;
  type f;
  Alloc *local_178;
  void *local_170;
  Read<signed_char> local_168;
  Alloc *local_158;
  void *local_150;
  Alloc *local_148;
  void *local_140;
  Alloc *local_138;
  void *local_130;
  int local_128;
  Alloc *local_120;
  void *local_118;
  Alloc *local_110;
  void *local_108;
  Write<double> local_100;
  string local_f0;
  Alloc *local_d0;
  void *local_c8;
  int local_c0;
  Alloc *local_b8;
  void *local_b0;
  Alloc *local_a8;
  void *local_a0;
  Alloc *local_98;
  void *pvStack_90;
  Alloc *local_88;
  void *pvStack_80;
  Alloc *local_78;
  void *pvStack_70;
  int local_68;
  Alloc *local_60;
  void *pvStack_58;
  Alloc *local_50;
  void *pvStack_48;
  Read<signed_char> local_40;
  
  local_168.write_.shared_alloc_.alloc = (densities->write_).shared_alloc_.alloc;
  if (((ulong)local_168.write_.shared_alloc_.alloc & 7) == 0 &&
      local_168.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_168.write_.shared_alloc_.alloc =
           (Alloc *)((local_168.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_168.write_.shared_alloc_.alloc)->use_count =
           (local_168.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_168.write_.shared_alloc_.direct_ptr = (densities->write_).shared_alloc_.direct_ptr;
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"");
  deep_copy<double>((Omega_h *)&local_178,&local_168,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,(ulong)(local_f0.field_2._M_allocated_capacity + 1));
  }
  pAVar6 = local_168.write_.shared_alloc_.alloc;
  if (((ulong)local_168.write_.shared_alloc_.alloc & 7) == 0 &&
      local_168.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_168.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_168.write_.shared_alloc_.alloc);
      operator_delete(pAVar6,0x48);
    }
  }
  uVar3 = mesh->dim_;
  if (3 < uVar3) {
    fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
         ,0x33);
  }
  local_158 = (cell_sizes->write_).shared_alloc_.alloc;
  if (((ulong)local_158 & 7) == 0 && local_158 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_158 = (Alloc *)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)&local_158->size)->_M_allocated_capacity * 8 + 1);
    }
    else {
      local_158->use_count = local_158->use_count + 1;
    }
  }
  local_150 = (cell_sizes->write_).shared_alloc_.direct_ptr;
  local_148 = (g->a2ab).write_.shared_alloc_.alloc;
  if (((ulong)local_148 & 7) == 0 && local_148 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_148 = (Alloc *)(local_148->size * 8 + 1);
    }
    else {
      local_148->use_count = local_148->use_count + 1;
    }
  }
  local_128 = uVar3 + 1;
  local_140 = (g->a2ab).write_.shared_alloc_.direct_ptr;
  local_138 = (g->ab2b).write_.shared_alloc_.alloc;
  if (((ulong)local_138 & 7) == 0 && local_138 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_138 = (Alloc *)(local_138->size * 8 + 1);
    }
    else {
      local_138->use_count = local_138->use_count + 1;
    }
  }
  local_130 = (g->ab2b).write_.shared_alloc_.direct_ptr;
  local_120 = (densities->write_).shared_alloc_.alloc;
  if (((ulong)local_120 & 7) == 0 && local_120 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_120 = (Alloc *)(local_120->size * 8 + 1);
    }
    else {
      local_120->use_count = local_120->use_count + 1;
    }
  }
  local_118 = (densities->write_).shared_alloc_.direct_ptr;
  local_110 = local_178;
  if (((ulong)local_178 & 7) == 0 && local_178 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_110 = (Alloc *)(local_178->size * 8 + 1);
    }
    else {
      local_178->use_count = local_178->use_count + 1;
    }
  }
  local_108 = local_170;
  LVar7 = Mesh::nelems(mesh);
  local_98 = local_158;
  if (((ulong)local_158 & 7) == 0 && local_158 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_98 = (Alloc *)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)&local_158->size)->_M_allocated_capacity * 8 + 1);
    }
    else {
      local_158->use_count = local_158->use_count + 1;
    }
  }
  pvStack_90 = local_150;
  local_88 = local_148;
  if (((ulong)local_148 & 7) == 0 && local_148 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_88 = (Alloc *)(local_148->size * 8 + 1);
    }
    else {
      local_148->use_count = local_148->use_count + 1;
    }
  }
  pvStack_80 = local_140;
  local_78 = local_138;
  if (((ulong)local_138 & 7) == 0 && local_138 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_78 = (Alloc *)(local_138->size * 8 + 1);
    }
    else {
      local_138->use_count = local_138->use_count + 1;
    }
  }
  pvStack_70 = local_130;
  local_68 = local_128;
  local_60 = local_120;
  if (((ulong)local_120 & 7) == 0 && local_120 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_60 = (Alloc *)(local_120->size * 8 + 1);
    }
    else {
      local_120->use_count = local_120->use_count + 1;
    }
  }
  pvStack_58 = local_118;
  local_50 = local_110;
  if (((ulong)local_110 & 7) == 0 && local_110 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_50 = (Alloc *)(local_110->size * 8 + 1);
    }
    else {
      local_110->use_count = local_110->use_count + 1;
    }
  }
  pvStack_48 = local_108;
  if (0 < LVar7) {
    local_f0._M_dataplus._M_p = (pointer)local_98;
    local_f0._M_string_length = (size_type)local_150;
    if (((ulong)local_98 & 7) == 0 && local_98 != (Alloc *)0x0) {
      local_98->use_count = local_98->use_count + -1;
      local_f0._M_dataplus._M_p =
           (pointer)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)&local_98->size)->_M_allocated_capacity * 8 + 1);
    }
    local_98 = (Alloc *)0x0;
    pvStack_90 = (void *)0x0;
    local_f0.field_2._M_allocated_capacity = (size_type)local_88;
    local_f0.field_2._8_8_ = local_140;
    if (((ulong)local_88 & 7) == 0 && local_88 != (Alloc *)0x0) {
      local_88->use_count = local_88->use_count + -1;
      local_f0.field_2._M_allocated_capacity = local_88->size * 8 + 1;
    }
    local_88 = (Alloc *)0x0;
    pvStack_80 = (void *)0x0;
    local_d0 = local_78;
    local_c8 = local_130;
    if (((ulong)local_78 & 7) == 0 && local_78 != (Alloc *)0x0) {
      local_78->use_count = local_78->use_count + -1;
      local_d0 = (Alloc *)(local_78->size * 8 + 1);
    }
    local_78 = (Alloc *)0x0;
    pvStack_70 = (void *)0x0;
    local_c0 = local_128;
    local_b8 = local_60;
    local_b0 = local_118;
    if (((ulong)local_60 & 7) == 0 && local_60 != (Alloc *)0x0) {
      local_60->use_count = local_60->use_count + -1;
      local_b8 = (Alloc *)(local_60->size * 8 + 1);
    }
    local_60 = (Alloc *)0x0;
    pvStack_58 = (void *)0x0;
    local_a8 = local_50;
    local_a0 = local_108;
    if (((ulong)local_50 & 7) == 0 && local_50 != (Alloc *)0x0) {
      local_50->use_count = local_50->use_count + -1;
      local_a8 = (Alloc *)(local_50->size * 8 + 1);
    }
    local_50 = (Alloc *)0x0;
    pvStack_48 = (void *)0x0;
    entering_parallel = '\0';
    lVar9 = 0;
    do {
      iVar4 = *(int *)((long)local_140 + lVar9 * 4);
      lVar10 = (long)iVar4;
      iVar5 = *(int *)((long)local_140 + lVar9 * 4 + 4);
      if (iVar4 < iVar5) {
        dVar2 = *(double *)((long)local_150 + lVar9 * 8);
        do {
          lVar11 = (long)*(int *)((long)local_130 + lVar10 * 4);
          dVar12 = *(double *)((long)local_150 + lVar11 * 8);
          if (dVar2 <= dVar12) {
            dVar12 = dVar2;
          }
          *(double *)((long)local_108 + lVar9 * 8) =
               (*(double *)((long)local_118 + lVar11 * 8) - *(double *)((long)local_118 + lVar9 * 8)
               ) * (dVar12 / (dVar2 * (double)local_128)) + *(double *)((long)local_108 + lVar9 * 8)
          ;
          lVar10 = lVar10 + 1;
        } while (iVar5 != lVar10);
      }
      lVar9 = lVar9 + 1;
    } while (LVar7 != (int)lVar9);
    diffuse_densities_once(Omega_h::Mesh*,Omega_h::Graph,Omega_h::Read<double>,Omega_h::Read<double>)
    ::$_0::~__0((__0 *)&local_f0);
  }
  diffuse_densities_once(Omega_h::Mesh*,Omega_h::Graph,Omega_h::Read<double>,Omega_h::Read<double>)
  ::$_0::~__0((__0 *)&local_98);
  uVar3 = mesh->dim_;
  if (uVar3 < 4) {
    local_100.shared_alloc_.alloc = local_178;
    if (((ulong)local_178 & 7) == 0 && local_178 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_100.shared_alloc_.alloc = (Alloc *)(local_178->size * 8 + 1);
      }
      else {
        local_178->use_count = local_178->use_count + 1;
      }
    }
    local_100.shared_alloc_.direct_ptr = local_170;
    Read<double>::Read(&local_40,&local_100);
    Mesh::sync_array<double>((Mesh *)this,(Int)mesh,(Read<double> *)(ulong)uVar3,(Int)&local_40);
    if (((ulong)local_40.write_.shared_alloc_.alloc & 7) == 0 &&
        local_40.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_40.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_40.write_.shared_alloc_.alloc);
        operator_delete(local_40.write_.shared_alloc_.alloc,0x48);
      }
    }
    pAVar6 = local_100.shared_alloc_.alloc;
    if (((ulong)local_100.shared_alloc_.alloc & 7) == 0 &&
        local_100.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_100.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_100.shared_alloc_.alloc);
        operator_delete(pAVar6,0x48);
      }
    }
    diffuse_densities_once(Omega_h::Mesh*,Omega_h::Graph,Omega_h::Read<double>,Omega_h::Read<double>)
    ::$_0::~__0((__0 *)&local_158);
    pvVar8 = extraout_RDX;
    if (((ulong)local_178 & 7) == 0 && local_178 != (Alloc *)0x0) {
      piVar1 = &local_178->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_178);
        operator_delete(local_178,0x48);
        pvVar8 = extraout_RDX_00;
      }
    }
    RVar13.write_.shared_alloc_.direct_ptr = pvVar8;
    RVar13.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Reals)RVar13.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
       ,0x33);
}

Assistant:

Reals diffuse_densities_once(
    Mesh* mesh, Graph g, Reals densities, Reals cell_sizes) {
  auto out = deep_copy(densities);
  auto max_deg = mesh->dim() + 1;
  auto f = OMEGA_H_LAMBDA(LO e) {
    auto s = cell_sizes[e];
    for (auto ee = g.a2ab[e]; ee < g.a2ab[e + 1]; ++ee) {
      auto oe = g.ab2b[ee];
      auto os = cell_sizes[oe];
      auto mins = min2(s, os);  // minimum of this and other cell size
      /* get difference in densities, multiply by (mins / max_deg)
         to get a mass value that is below the stable limit,
         then divide that mass value by (s) to get the density
         delta to add to this density */
      auto factor = mins / (s * max_deg);
      auto x = densities[e];
      auto ox = densities[oe];
      out[e] += (ox - x) * factor;
    }
  };
  parallel_for(mesh->nelems(), f, "diffuse_densities");
  return mesh->sync_array(mesh->dim(), Reals(out), 1);
}